

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

int Jf_CutCheckMffc_rec(Jf_Man_t *p,int *pCut,int Limit)

{
  int *piVar1;
  uint uVar2;
  word *pwVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  if ((*pCut & 0xf) != 0) {
    uVar7 = 0;
    do {
      uVar6 = pCut[uVar7 + 1];
      if ((int)uVar6 < 0) {
LAB_00700047:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (uVar6 < 2) {
        return 1;
      }
      uVar6 = uVar6 >> 1;
      piVar1 = p->pGia->pRefs + uVar6;
      *piVar1 = *piVar1 + -1;
      bVar8 = false;
      if (*piVar1 == 0) {
        if ((p->vCuts).nSize <= (int)uVar6) goto LAB_00700066;
        uVar2 = (p->vCuts).pArray[uVar6];
        pwVar3 = (p->pMem).pPages[(int)uVar2 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar5 = (long)(int)(uVar2 & (p->pMem).uPageMask);
        bVar8 = true;
        if ((*(uint *)((long)pwVar3 + lVar5 * 8 + 4) & 0xf) == 1) {
          uVar2 = (uint)pwVar3[lVar5 + 1];
          if ((int)uVar2 < 0) goto LAB_00700047;
          bVar8 = uVar2 >> 1 != uVar6;
        }
      }
      Vec_IntPush(p->vTemp,uVar6);
      if (Limit <= p->vTemp->nSize) {
        return 0;
      }
      if (bVar8) {
        if ((p->vCuts).nSize <= (int)uVar6) {
LAB_00700066:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = (p->vCuts).pArray[uVar6];
        iVar4 = Jf_CutCheckMffc_rec(p,(int *)((long)(p->pMem).pPages
                                                    [(int)uVar6 >>
                                                     ((byte)(p->pMem).nPageSize & 0x1f)] +
                                             (long)(int)(uVar6 & (p->pMem).uPageMask) * 8 + 4),Limit
                                   );
        if (iVar4 == 0) {
          return 0;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (*pCut & 0xf));
  }
  return 1;
}

Assistant:

int Jf_CutCheckMffc_rec( Jf_Man_t * p, int * pCut, int Limit )
{
    int i, Var;
    Jf_CutForEachVar( pCut, Var, i )
    {
        int fRecur = (!Gia_ObjRefDecId(p->pGia, Var) && !Jf_CutIsTriv(Jf_ObjCutBest(p, Var), Var));
        Vec_IntPush( p->vTemp, Var );
        if ( Vec_IntSize(p->vTemp) >= Limit )
            return 0;
        if ( fRecur && !Jf_CutCheckMffc_rec( p, Jf_ObjCutBest(p, Var), Limit ) )
            return 0;
    }
    return 1;
}